

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O1

void __thiscall
helix::order_book::
remove<std::map<unsigned_long,helix::price_level,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>>
          (order_book *this,order *o,
          map<unsigned_long,_helix::price_level,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
          *levels)

{
  _Rb_tree_header *p_Var1;
  uint64_t *puVar2;
  invalid_argument *this_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  iterator __position;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  p_Var4 = (levels->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(levels->_M_t)._M_impl.super__Rb_tree_header;
  p_Var3 = &p_Var1->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      bVar5 = *(ulong *)(p_Var4 + 1) < o->price;
      if (!bVar5) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar5];
    } while (p_Var4 != (_Base_ptr)0x0);
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (__position._M_node = p_Var3, o->price < *(ulong *)(p_Var3 + 1))) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"invalid price: ","");
    std::__cxx11::to_string(&local_60,o->price);
    std::operator+(&local_40,&local_80,&local_60);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  puVar2 = &o->level->size;
  *puVar2 = *puVar2 - o->quantity;
  if (__position._M_node[1]._M_left == (_Base_ptr)0x0) {
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,helix::price_level>,std::_Select1st<std::pair<unsigned_long_const,helix::price_level>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,helix::price_level>,std::_Select1st<std::pair<unsigned_long_const,helix::price_level>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>
                        *)levels,__position);
    return;
  }
  return;
}

Assistant:

void order_book::remove(const order& o, T& levels)
{
    auto it = levels.find(o.price);
    if (it == levels.end()) {
        throw std::invalid_argument(std::string("invalid price: ") + std::to_string(o.price));
    }
    auto&& level = it->second;
    o.level->size -= o.quantity;
    if (level.size == 0) {
        levels.erase(it);
    }
}